

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# packet.cpp
# Opt level: O0

void __thiscall PacketBuilder::~PacketBuilder(PacketBuilder *this)

{
  char local_21;
  char *local_20;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_18;
  PacketBuilder *local_10;
  PacketBuilder *this_local;
  
  local_10 = this;
  local_18._M_current = (char *)std::begin<std::__cxx11::string>(&this->data);
  local_20 = (char *)std::end<std::__cxx11::string>(&this->data);
  local_21 = '\0';
  std::fill<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,char>
            (local_18,(__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                       )local_20,&local_21);
  std::__cxx11::string::~string((string *)&this->data);
  return;
}

Assistant:

PacketBuilder::~PacketBuilder()
{
	std::fill(UTIL_RANGE(this->data), '\0');
}